

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O2

void get_msurf_descriptor_haar_unroll_1_4_True(integral_image *iimage,interest_point *ipoint)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int i;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  int k0;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  float *pfVar28;
  float *pfVar29;
  long lVar30;
  long lVar31;
  float *pfVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  undefined1 auVar57 [16];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  float fVar64;
  undefined1 auVar65 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  undefined1 auVar69 [64];
  
  auVar41._8_4_ = 0x3effffff;
  auVar41._0_8_ = 0x3effffff3effffff;
  auVar41._12_4_ = 0x3effffff;
  auVar40._8_4_ = 0x80000000;
  auVar40._0_8_ = 0x8000000080000000;
  auVar40._12_4_ = 0x80000000;
  auVar63 = ZEXT1664(auVar40);
  fVar46 = ipoint->scale;
  auVar69 = ZEXT464((uint)fVar46);
  auVar37 = ZEXT816(0x3fe0000000000000);
  auVar62 = ZEXT1664(auVar37);
  auVar42 = ZEXT416((uint)fVar46);
  auVar33 = vpternlogd_avx512vl(auVar41,auVar42,auVar40,0xf8);
  auVar33 = ZEXT416((uint)(fVar46 + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  fVar45 = -0.08 / (fVar46 * fVar46);
  iVar20 = (int)auVar33._0_4_;
  auVar34._0_4_ = (int)auVar33._0_4_;
  auVar34._4_4_ = (int)auVar33._4_4_;
  auVar34._8_4_ = (int)auVar33._8_4_;
  auVar34._12_4_ = (int)auVar33._12_4_;
  auVar33 = vcvtdq2ps_avx(auVar34);
  auVar34 = vpternlogd_avx512vl(auVar41,ZEXT416((uint)ipoint->x),auVar40,0xf8);
  auVar34 = ZEXT416((uint)(ipoint->x + auVar34._0_4_));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  auVar35._0_8_ = (double)auVar34._0_4_;
  auVar35._8_8_ = auVar34._8_8_;
  auVar39._0_8_ = (double)fVar46;
  auVar39._8_8_ = 0;
  auVar34 = vfmadd231sd_fma(auVar35,auVar39,auVar37);
  auVar38._0_4_ = (float)auVar34._0_8_;
  auVar38._4_12_ = auVar34._4_12_;
  auVar34 = vpternlogd_avx512vl(auVar41,ZEXT416((uint)ipoint->y),auVar40,0xf8);
  fVar3 = auVar38._0_4_ - auVar33._0_4_;
  auVar34 = ZEXT416((uint)(ipoint->y + auVar34._0_4_));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  auVar36._0_8_ = (double)auVar34._0_4_;
  auVar36._8_8_ = auVar34._8_8_;
  auVar34 = vfmadd231sd_fma(auVar36,auVar39,auVar37);
  auVar37._0_4_ = (float)auVar34._0_8_;
  auVar37._4_12_ = auVar34._4_12_;
  fVar68 = auVar37._0_4_ - auVar33._0_4_;
  auVar35 = ZEXT416((uint)fVar46);
  auVar33 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar35,auVar38);
  auVar34 = vpternlogd_avx512vl(auVar41,auVar33,auVar40,0xf8);
  auVar33 = ZEXT416((uint)(auVar33._0_4_ + auVar34._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  if (iVar20 < (int)auVar33._0_4_) {
    auVar43._8_4_ = 0x3effffff;
    auVar43._0_8_ = 0x3effffff3effffff;
    auVar43._12_4_ = 0x3effffff;
    auVar44._8_4_ = 0x80000000;
    auVar44._0_8_ = 0x8000000080000000;
    auVar44._12_4_ = 0x80000000;
    auVar33 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar35,auVar37);
    auVar34 = vpternlogd_avx512vl(auVar44,auVar33,auVar43,0xea);
    auVar33 = ZEXT416((uint)(auVar33._0_4_ + auVar34._0_4_));
    auVar33 = vroundss_avx(auVar33,auVar33,0xb);
    if (iVar20 < (int)auVar33._0_4_) {
      auVar33 = vfmadd231ss_fma(auVar38,auVar35,ZEXT416(0x41300000));
      auVar59._8_4_ = 0x80000000;
      auVar59._0_8_ = 0x8000000080000000;
      auVar59._12_4_ = 0x80000000;
      auVar34 = vpternlogd_avx512vl(auVar59,auVar33,auVar43,0xea);
      auVar33 = ZEXT416((uint)(auVar33._0_4_ + auVar34._0_4_));
      auVar33 = vroundss_avx(auVar33,auVar33,0xb);
      if ((int)auVar33._0_4_ + iVar20 <= iimage->width) {
        auVar33 = vfmadd231ss_fma(auVar37,auVar35,ZEXT416(0x41300000));
        auVar12._8_4_ = 0x80000000;
        auVar12._0_8_ = 0x8000000080000000;
        auVar12._12_4_ = 0x80000000;
        auVar34 = vpternlogd_avx512vl(auVar43,auVar33,auVar12,0xf8);
        auVar33 = ZEXT416((uint)(auVar33._0_4_ + auVar34._0_4_));
        auVar33 = vroundss_avx(auVar33,auVar33,0xb);
        if ((int)auVar33._0_4_ + iVar20 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          iVar15 = -0xc;
          lVar31 = 0xc;
          for (lVar17 = 0; lVar17 != 0x18; lVar17 = lVar17 + 1) {
            auVar33._0_4_ = (float)iVar15;
            auVar33._4_12_ = in_ZMM8._4_12_;
            auVar33 = vfmadd213ss_fma(auVar33,auVar69._0_16_,ZEXT416((uint)(fVar68 + 0.5)));
            iVar14 = (int)auVar33._0_4_;
            lVar30 = lVar31;
            for (iVar22 = -0xc; iVar22 < 0xc; iVar22 = iVar22 + 4) {
              auVar49._0_4_ = (float)iVar22;
              auVar49._4_12_ = in_ZMM8._4_12_;
              auVar33 = vfmadd213ss_fma(auVar49,auVar42,ZEXT416((uint)fVar3));
              auVar50._0_4_ = (float)(iVar22 + 1);
              auVar50._4_12_ = in_ZMM8._4_12_;
              auVar34 = vfmadd213ss_fma(auVar50,auVar42,ZEXT416((uint)fVar3));
              auVar51._0_4_ = (float)(iVar22 + 2);
              auVar51._4_12_ = auVar63._4_12_;
              auVar35 = vfmadd213ss_fma(auVar51,auVar42,ZEXT416((uint)fVar3));
              auVar52._0_4_ = (float)(iVar22 + 3);
              auVar52._4_12_ = auVar62._4_12_;
              auVar36 = vfmadd213ss_fma(auVar52,auVar42,ZEXT416((uint)fVar3));
              haarXY_unconditional
                        (iimage,iVar14,(int)auVar33._0_4_,iVar20,
                         (float *)((long)haarResponseX + lVar30 + -0xc),
                         (float *)((long)haarResponseY + lVar30 + -0xc));
              haarXY_unconditional
                        (iimage,iVar14,(int)auVar34._0_4_,iVar20,
                         (float *)((long)haarResponseX + lVar30 + -8),
                         (float *)((long)haarResponseY + lVar30 + -8));
              haarXY_unconditional
                        (iimage,iVar14,(int)auVar35._0_4_,iVar20,
                         (float *)((long)haarResponseX + lVar30 + -4),
                         (float *)((long)haarResponseY + lVar30 + -4));
              haarXY_unconditional
                        (iimage,iVar14,(int)auVar36._0_4_,iVar20,
                         (float *)((long)haarResponseX + lVar30),
                         (float *)((long)haarResponseY + lVar30));
              lVar30 = lVar30 + 0x10;
            }
            auVar69 = ZEXT1664(auVar42);
            iVar15 = iVar15 + 1;
            lVar31 = lVar31 + 0x60;
          }
          goto LAB_0015dd4b;
        }
      }
    }
  }
  iVar15 = -0xc;
  lVar31 = 0xc;
  for (lVar17 = 0; lVar17 != 0x18; lVar17 = lVar17 + 1) {
    auVar47._0_4_ = (float)iVar15;
    auVar47._4_12_ = in_ZMM8._4_12_;
    auVar33 = vfmadd213ss_fma(auVar47,auVar69._0_16_,ZEXT416((uint)fVar68));
    fVar46 = auVar33._0_4_;
    iVar14 = (int)((double)((ulong)(0.0 <= fVar46) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar46) * -0x4020000000000000) + (double)fVar46);
    lVar30 = lVar31;
    for (iVar22 = -0xc; iVar22 < 0xc; iVar22 = iVar22 + 4) {
      auVar48._0_4_ = (float)iVar22;
      auVar65 = in_ZMM8._4_12_;
      auVar48._4_12_ = auVar65;
      auVar33 = vfmadd213ss_fma(auVar48,auVar42,ZEXT416((uint)fVar3));
      auVar54._0_4_ = (float)(iVar22 + 1);
      auVar54._4_12_ = auVar65;
      auVar57._0_4_ = (float)(iVar22 + 2);
      auVar57._4_12_ = auVar65;
      auVar60._0_4_ = (float)(iVar22 + 3);
      auVar60._4_12_ = auVar65;
      auVar34 = vfmadd213ss_fma(auVar54,auVar42,ZEXT416((uint)fVar3));
      auVar35 = vfmadd213ss_fma(auVar57,auVar42,ZEXT416((uint)fVar3));
      auVar36 = vfmadd213ss_fma(auVar60,auVar42,ZEXT416((uint)fVar3));
      fVar46 = auVar33._0_4_;
      fVar53 = auVar34._0_4_;
      fVar55 = auVar35._0_4_;
      fVar58 = auVar36._0_4_;
      haarXY_precheck_boundaries
                (iimage,iVar14,
                 (int)((double)((ulong)(0.0 <= fVar46) * 0x3fe0000000000000 +
                               (ulong)(0.0 > fVar46) * -0x4020000000000000) + (double)fVar46),iVar20
                 ,(float *)((long)haarResponseX + lVar30 + -0xc),
                 (float *)((long)haarResponseY + lVar30 + -0xc));
      haarXY_precheck_boundaries
                (iimage,iVar14,
                 (int)((double)((ulong)(0.0 <= fVar53) * 0x3fe0000000000000 +
                               (ulong)(0.0 > fVar53) * -0x4020000000000000) + (double)fVar53),iVar20
                 ,(float *)((long)haarResponseX + lVar30 + -8),
                 (float *)((long)haarResponseY + lVar30 + -8));
      haarXY_precheck_boundaries
                (iimage,iVar14,
                 (int)((double)((ulong)(0.0 <= fVar55) * 0x3fe0000000000000 +
                               (ulong)(0.0 > fVar55) * -0x4020000000000000) + (double)fVar55),iVar20
                 ,(float *)((long)haarResponseX + lVar30 + -4),
                 (float *)((long)haarResponseY + lVar30 + -4));
      haarXY_precheck_boundaries
                (iimage,iVar14,
                 (int)((double)((ulong)(0.0 <= fVar58) * 0x3fe0000000000000 +
                               (ulong)(0.0 > fVar58) * -0x4020000000000000) + (double)fVar58),iVar20
                 ,(float *)((long)haarResponseX + lVar30),(float *)((long)haarResponseY + lVar30));
      lVar30 = lVar30 + 0x10;
    }
    auVar69 = ZEXT1664(auVar42);
    iVar15 = iVar15 + 1;
    lVar31 = lVar31 + 0x60;
  }
LAB_0015dd4b:
  fVar68 = auVar69._0_4_;
  auVar67._8_4_ = 0x3effffff;
  auVar67._0_8_ = 0x3effffff3effffff;
  auVar67._12_4_ = 0x3effffff;
  auVar66._8_4_ = 0x80000000;
  auVar66._0_8_ = 0x8000000080000000;
  auVar66._12_4_ = 0x80000000;
  auVar33 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 0.5)),auVar66,0xf8);
  auVar33 = ZEXT416((uint)(fVar68 * 0.5 + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  auVar34 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 1.5)),auVar66,0xf8);
  auVar34 = ZEXT416((uint)(fVar68 * 1.5 + auVar34._0_4_));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  auVar35 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 2.5)),auVar66,0xf8);
  auVar35 = ZEXT416((uint)(fVar68 * 2.5 + auVar35._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  auVar36 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 3.5)),auVar66,0xf8);
  auVar36 = ZEXT416((uint)(fVar68 * 3.5 + auVar36._0_4_));
  auVar36 = vroundss_avx(auVar36,auVar36,0xb);
  auVar37 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 4.5)),auVar66,0xf8);
  auVar37 = ZEXT416((uint)(fVar68 * 4.5 + auVar37._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar38 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 5.5)),auVar66,0xf8);
  auVar38 = ZEXT416((uint)(fVar68 * 5.5 + auVar38._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  auVar39 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 6.5)),auVar66,0xf8);
  auVar39 = ZEXT416((uint)(fVar68 * 6.5 + auVar39._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar40 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 7.5)),auVar66,0xf8);
  auVar40 = ZEXT416((uint)(auVar40._0_4_ + fVar68 * 7.5));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 8.5)),auVar66,0xf8);
  auVar41 = ZEXT416((uint)(fVar68 * 8.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 9.5)),auVar66,0xf8);
  auVar42 = ZEXT416((uint)(fVar68 * 9.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 10.5)),auVar66,0xf8);
  auVar43 = ZEXT416((uint)(fVar68 * 10.5 + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 11.5)),auVar66,0xf8);
  fVar56 = auVar35._0_4_;
  fVar46 = fVar56 + auVar34._0_4_;
  fVar3 = fVar56 + auVar33._0_4_;
  auVar35 = ZEXT416((uint)(fVar68 * 11.5 + auVar44._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  fVar68 = fVar56 - auVar33._0_4_;
  fVar53 = fVar56 - auVar34._0_4_;
  fVar55 = fVar56 - auVar36._0_4_;
  fVar58 = fVar56 - auVar37._0_4_;
  fVar4 = fVar56 - auVar38._0_4_;
  fVar56 = fVar56 - auVar39._0_4_;
  fVar64 = auVar40._0_4_;
  fVar5 = fVar64 - auVar36._0_4_;
  fVar6 = fVar64 - auVar37._0_4_;
  fVar7 = fVar64 - auVar38._0_4_;
  fVar8 = fVar64 - auVar39._0_4_;
  fVar9 = fVar64 - auVar41._0_4_;
  fVar10 = fVar64 - auVar42._0_4_;
  fVar11 = fVar64 - auVar43._0_4_;
  fVar64 = fVar64 - auVar35._0_4_;
  gauss_s1_c0[0] = expf(fVar46 * fVar46 * fVar45);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar45);
  gauss_s1_c0[2] = expf(fVar68 * fVar68 * fVar45);
  gauss_s1_c0[3] = expf(fVar53 * fVar53 * fVar45);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar55 * fVar55 * fVar45);
  gauss_s1_c0[6] = expf(fVar58 * fVar58 * fVar45);
  gauss_s1_c0[7] = expf(fVar4 * fVar4 * fVar45);
  gauss_s1_c0[8] = expf(fVar56 * fVar56 * fVar45);
  gauss_s1_c1[0] = expf(fVar5 * fVar5 * fVar45);
  gauss_s1_c1[1] = expf(fVar6 * fVar6 * fVar45);
  gauss_s1_c1[2] = expf(fVar7 * fVar7 * fVar45);
  gauss_s1_c1[3] = expf(fVar8 * fVar8 * fVar45);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar9 * fVar9 * fVar45);
  gauss_s1_c1[6] = expf(fVar10 * fVar10 * fVar45);
  gauss_s1_c1[7] = expf(fVar11 * fVar11 * fVar45);
  gauss_s1_c1[8] = expf(fVar64 * fVar64 * fVar45);
  auVar62 = ZEXT1264(ZEXT812(0));
  lVar31 = 0;
  auVar42._8_4_ = 0x7fffffff;
  auVar42._0_8_ = 0x7fffffff7fffffff;
  auVar42._12_4_ = 0x7fffffff;
  iVar20 = 0;
  lVar17 = 0;
  uVar19 = 0xfffffffffffffff8;
  while (uVar16 = (uint)uVar19, (int)uVar16 < 8) {
    pfVar29 = gauss_s1_c1;
    if (uVar16 != 7) {
      pfVar29 = gauss_s1_c0;
    }
    lVar30 = (long)iVar20;
    lVar17 = (long)(int)lVar17;
    iVar20 = iVar20 + 4;
    if (uVar16 == 0xfffffff8) {
      pfVar29 = gauss_s1_c1;
    }
    uVar21 = 0;
    uVar27 = 0xfffffffffffffff8;
    lVar23 = lVar31;
    while (lVar30 != iVar20) {
      pfVar32 = gauss_s1_c1;
      iVar15 = (int)uVar27;
      if (iVar15 != 7) {
        pfVar32 = gauss_s1_c0;
      }
      auVar63 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar27 = (ulong)((uint)(uVar27 >> 0x1c) & 8);
      if (iVar15 == -8) {
        pfVar32 = gauss_s1_c1;
      }
      lVar24 = (long)haarResponseX + lVar23;
      lVar25 = (long)haarResponseY + lVar23;
      for (uVar18 = uVar21; uVar18 < iVar15 * 0x18 + 0x198; uVar18 = uVar18 + 0x18) {
        lVar26 = 0;
        pfVar28 = (float *)((long)pfVar29 + (ulong)(((uint)(uVar19 >> 0x1f) & 1) << 5));
        while (lVar26 != 9) {
          fVar46 = *pfVar28;
          pfVar28 = pfVar28 + (ulong)(~uVar16 >> 0x1f) * 2 + -1;
          lVar1 = lVar26 * 4;
          lVar2 = lVar26 * 4;
          lVar26 = lVar26 + 1;
          auVar35 = ZEXT416((uint)(pfVar32[uVar27] * fVar46 * *(float *)(lVar24 + lVar2)));
          auVar33 = vandps_avx(auVar35,auVar42);
          auVar36 = ZEXT416((uint)(pfVar32[uVar27] * fVar46 * *(float *)(lVar25 + lVar1)));
          auVar34 = vandps_avx(auVar36,auVar42);
          auVar35 = vinsertps_avx(auVar36,auVar35,0x10);
          auVar34 = vmovlhps_avx(auVar35,auVar34);
          auVar33 = vinsertps_avx(auVar34,auVar33,0x30);
          auVar63 = ZEXT1664(CONCAT412(auVar63._12_4_ + auVar33._12_4_,
                                       CONCAT48(auVar63._8_4_ + auVar33._8_4_,
                                                CONCAT44(auVar63._4_4_ + auVar33._4_4_,
                                                         auVar63._0_4_ + auVar33._0_4_))));
        }
        uVar27 = uVar27 + (ulong)(-1 < iVar15) * 2 + -1;
        lVar24 = lVar24 + 0x60;
        lVar25 = lVar25 + 0x60;
      }
      uVar27 = (ulong)(iVar15 + 5);
      uVar21 = uVar21 + 0x78;
      lVar23 = lVar23 + 0x1e0;
      fVar46 = gauss_s2_arr[lVar30];
      auVar13._4_4_ = fVar46;
      auVar13._0_4_ = fVar46;
      auVar13._8_4_ = fVar46;
      auVar13._12_4_ = fVar46;
      auVar36 = vmulps_avx512vl(auVar63._0_16_,auVar13);
      lVar30 = lVar30 + 1;
      auVar61._0_4_ = auVar36._0_4_ * auVar36._0_4_;
      auVar61._4_4_ = auVar36._4_4_ * auVar36._4_4_;
      auVar61._8_4_ = auVar36._8_4_ * auVar36._8_4_;
      auVar61._12_4_ = auVar36._12_4_ * auVar36._12_4_;
      auVar34 = vshufpd_avx(auVar36,auVar36,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar17) = auVar36;
      lVar17 = lVar17 + 4;
      auVar33 = vmovshdup_avx(auVar61);
      auVar35 = vfmadd231ss_fma(auVar33,auVar36,auVar36);
      auVar33 = vshufps_avx(auVar36,auVar36,0xff);
      auVar34 = vfmadd213ss_fma(auVar34,auVar34,auVar35);
      auVar33 = vfmadd213ss_fma(auVar33,auVar33,auVar34);
      auVar62 = ZEXT464((uint)(auVar62._0_4_ + auVar33._0_4_));
    }
    lVar31 = lVar31 + 0x14;
    uVar19 = (ulong)(uVar16 + 5);
  }
  if (auVar62._0_4_ < 0.0) {
    fVar46 = sqrtf(auVar62._0_4_);
  }
  else {
    auVar33 = vsqrtss_avx(auVar62._0_16_,auVar62._0_16_);
    fVar46 = auVar33._0_4_;
  }
  for (lVar31 = 0; lVar31 != 0x40; lVar31 = lVar31 + 1) {
    ipoint->descriptor[lVar31] = (1.0 / fVar46) * ipoint->descriptor[lVar31];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_4_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}